

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

void unreversed_copy(int N,v4sf *in,v4sf *out,int out_stride)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  v4sf *pafVar10;
  int iVar11;
  v4sf *pafVar12;
  v4sf *pafVar13;
  float fVar14;
  float fVar15;
  
  fVar1 = (*in)[0];
  fVar2 = (*in)[1];
  pafVar13 = in + 1;
  pafVar12 = out + 1;
  fVar14 = (*in)[2];
  fVar15 = (*in)[3];
  for (iVar11 = 1; iVar11 < N; iVar11 = iVar11 + 1) {
    fVar6 = (*pafVar13)[0];
    fVar7 = (*pafVar13)[1];
    fVar8 = (*pafVar13)[2];
    fVar9 = (*pafVar13)[3];
    fVar3 = pafVar13[1][0];
    pafVar10 = pafVar13 + 1;
    fVar4 = pafVar13[1][2];
    fVar5 = pafVar13[1][3];
    pafVar13 = pafVar13 + 2;
    (*pafVar12)[0] = (*pafVar10)[1];
    (*pafVar12)[1] = fVar9;
    (*pafVar12)[2] = fVar7;
    (*pafVar12)[3] = fVar15;
    pafVar12[-1][0] = fVar3;
    pafVar12[-1][1] = fVar8;
    pafVar12[-1][2] = fVar6;
    pafVar12[-1][3] = fVar14;
    pafVar12 = pafVar12 + -8;
    fVar14 = fVar4;
    fVar15 = fVar5;
  }
  fVar3 = (*pafVar13)[0];
  fVar4 = (*pafVar13)[1];
  fVar5 = (*pafVar13)[2];
  fVar6 = (*pafVar13)[3];
  (*pafVar12)[0] = fVar2;
  (*pafVar12)[1] = fVar6;
  (*pafVar12)[2] = fVar4;
  (*pafVar12)[3] = fVar15;
  pafVar12[-1][0] = fVar1;
  pafVar12[-1][1] = fVar5;
  pafVar12[-1][2] = fVar3;
  pafVar12[-1][3] = fVar14;
  return;
}

Assistant:

static void unreversed_copy(int N, const v4sf *in, v4sf *out, int out_stride) {
  v4sf g0, g1, h0, h1;
  int k;
  g0 = g1 = in[0]; ++in;
  for (k=1; k < N; ++k) {
    h0 = *in++; h1 = *in++;
    g1 = VSWAPHL(g1, h0);
    h0 = VSWAPHL(h0, h1);
    UNINTERLEAVE2(h0, g1, out[0], out[1]); out += out_stride;
    g1 = h1;
  }
  h0 = *in++; h1 = g0;
  g1 = VSWAPHL(g1, h0);
  h0 = VSWAPHL(h0, h1);
  UNINTERLEAVE2(h0, g1, out[0], out[1]);
}